

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::type_is_top_level_physical_pointer(Compiler *this,SPIRType *type)

{
  uint uVar1;
  bool bVar2;
  SPIRType *pSVar3;
  
  bVar2 = false;
  if ((type->pointer == true) && (bVar2 = false, type->storage == StorageClassPhysicalStorageBuffer)
     ) {
    uVar1 = type->pointer_depth;
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (type->parent_type).id);
    bVar2 = pSVar3->pointer_depth < uVar1;
  }
  return bVar2;
}

Assistant:

bool Compiler::type_is_top_level_physical_pointer(const SPIRType &type) const
{
	return type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
	       type.pointer_depth > get<SPIRType>(type.parent_type).pointer_depth;
}